

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O3

string * __thiscall
duckdb::Prefix::VerifyAndToString_abi_cxx11_
          (string *__return_storage_ptr__,Prefix *this,ART *art,Node *node,bool only_verify)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  Node ptr_p;
  uint __len;
  string *psVar3;
  long *plVar4;
  size_type *psVar5;
  ulong uVar6;
  string child;
  string str;
  string __str;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string *local_70;
  char *local_68 [2];
  char local_58 [16];
  Prefix local_48;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_70 = __return_storage_ptr__;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,anon_var_dwarf_4f18422 + 9);
  paVar1 = &local_b0.field_2;
  do {
    ptr_p.super_IndexPointer.data = (IndexPointer)(art->super_BoundIndex).super_Index._vptr_Index;
    if (((ulong)ptr_p.super_IndexPointer.data & 0x7f00000000000000) != 0x100000000000000) break;
    Prefix(&local_48,(ART *)this,ptr_p,false,false);
    ::std::__cxx11::string::append((char *)&local_90);
    if (local_48.data[*(byte *)((long)&this[0x11].data + 2)] != '\0') {
      uVar6 = 0;
      do {
        bVar2 = local_48.data[uVar6];
        __len = 3 - (bVar2 < 100);
        if (bVar2 < 10) {
          __len = 1;
        }
        local_68[0] = local_58;
        ::std::__cxx11::string::_M_construct((ulong)local_68,(char)__len);
        ::std::__detail::__to_chars_10_impl<unsigned_int>(local_68[0],__len,(uint)bVar2);
        plVar4 = (long *)::std::__cxx11::string::append((char *)local_68);
        psVar5 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_b0.field_2._M_allocated_capacity = *psVar5;
          local_b0.field_2._8_8_ = plVar4[3];
          local_b0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar5;
          local_b0._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_b0._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != paVar1) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if (local_68[0] != local_58) {
          operator_delete(local_68[0]);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < local_48.data[*(byte *)((long)&this[0x11].data + 2)]);
    }
    ::std::__cxx11::string::append((char *)&local_90);
    art = (ART *)local_48.ptr;
  } while (-1 < (long)(((BoundIndex *)&(local_48.ptr)->super_IndexPointer)->super_Index)._vptr_Index
          );
  Node::VerifyAndToString_abi_cxx11_(&local_b0,(Node *)art,(ART *)this,SUB81(node,0));
  psVar3 = local_70;
  if (SUB81(node,0) == false) {
    ::std::operator+(local_70,&local_90,&local_b0);
  }
  else {
    (local_70->_M_dataplus)._M_p = (pointer)&local_70->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_70,anon_var_dwarf_4f18422 + 9)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return psVar3;
}

Assistant:

string Prefix::VerifyAndToString(ART &art, const Node &node, const bool only_verify) {
	string str = "";
	reference<const Node> ref(node);

	Iterator(art, ref, true, false, [&](Prefix &prefix) {
		D_ASSERT(prefix.data[Count(art)] != 0);
		D_ASSERT(prefix.data[Count(art)] <= Count(art));

		str += " Prefix :[ ";
		for (idx_t i = 0; i < prefix.data[Count(art)]; i++) {
			str += to_string(prefix.data[i]) + "-";
		}
		str += " ] ";
	});

	auto child = ref.get().VerifyAndToString(art, only_verify);
	return only_verify ? "" : str + child;
}